

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O0

string * __thiscall
helics::ValueFederateManager::localQuery_abi_cxx11_(ValueFederateManager *this,string_view queryStr)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  bool bVar1;
  int iVar2;
  reference pvVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Input *this_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined8 in_RCX;
  undefined8 in_RDX;
  string *in_RDI;
  DataType iType_1;
  Input inpTemp_1;
  Input *inp_2;
  const_iterator __end8;
  const_iterator __begin8;
  shared_handle *__range8;
  JsonBuilder JB_1;
  DataType iType;
  Input inpTemp;
  Input *inp_1;
  const_iterator __end7;
  const_iterator __begin7;
  shared_handle *__range7;
  JsonBuilder JB;
  Input *inp;
  const_iterator __end5;
  const_iterator __begin5;
  DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
  *__range5;
  int ii;
  shared_handle hand;
  string *ret;
  Input *in_stack_fffffffffffff8e8;
  Input *in_stack_fffffffffffff8f0;
  Input *in_stack_fffffffffffff8f8;
  char __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff900;
  undefined8 in_stack_fffffffffffff908;
  undefined4 in_stack_fffffffffffff910;
  undefined4 in_stack_fffffffffffff914;
  Input *in_stack_fffffffffffff918;
  undefined7 in_stack_fffffffffffff920;
  undefined1 in_stack_fffffffffffff927;
  Input *in_stack_fffffffffffff928;
  Input *in_stack_fffffffffffff930;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff938;
  Input *in_stack_fffffffffffff940;
  DataType local_614;
  string *in_stack_fffffffffffffa50;
  string *in_stack_fffffffffffffa58;
  undefined8 in_stack_fffffffffffffa60;
  pointer in_stack_fffffffffffffab0;
  string *in_stack_fffffffffffffab8;
  pointer in_stack_fffffffffffffac0;
  BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> local_4d8;
  BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> local_4c0;
  undefined1 local_4a8 [24];
  undefined1 *local_490;
  undefined8 local_470;
  undefined8 local_468;
  DataType local_404;
  Input local_400;
  Input *local_2d0;
  BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> local_2c8;
  BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> local_2b0;
  undefined1 local_298 [24];
  undefined1 *local_280;
  undefined8 local_260;
  undefined8 local_258;
  undefined1 local_248 [24];
  undefined1 local_230 [48];
  undefined8 local_200;
  undefined8 local_1f8;
  Input *local_1d0;
  BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> local_1c8;
  BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> local_1b0;
  DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
  *local_198;
  int local_18c;
  shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  local_188;
  undefined8 local_160;
  undefined8 local_158;
  undefined1 local_148 [24];
  undefined1 local_130 [48];
  undefined8 local_100;
  undefined8 local_f8;
  undefined1 local_e8 [24];
  undefined1 local_d0 [48];
  undefined8 local_a0;
  undefined8 local_98;
  undefined1 local_80 [24];
  undefined1 local_68 [48];
  undefined8 local_38;
  undefined8 local_30;
  undefined1 local_21;
  undefined8 local_18;
  undefined8 local_10;
  
  local_21 = 0;
  local_18 = in_RDX;
  local_10 = in_RCX;
  std::__cxx11::string::string(in_stack_fffffffffffff900);
  local_38 = local_18;
  local_30 = local_10;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff900,
             (char *)in_stack_fffffffffffff8f8);
  __x._M_str._0_7_ = in_stack_fffffffffffff920;
  __x._M_len = (size_t)in_stack_fffffffffffff918;
  __x._M_str._7_1_ = in_stack_fffffffffffff927;
  __y._M_str._0_4_ = in_stack_fffffffffffff910;
  __y._M_len = in_stack_fffffffffffff908;
  __y._M_str._4_4_ = in_stack_fffffffffffff914;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::lock_shared((shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                   *)in_stack_fffffffffffff928);
    generateStringVector_if<gmlc::libguarded::shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,helics::InterfaceHandle,(reference_stability)0,5>,std::mutex>,helics::ValueFederateManager::localQuery[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)const::__0,helics::ValueFederateManager::localQuery[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)const::__1>
              (local_68,local_80);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff940,in_stack_fffffffffffff938);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8f0);
    gmlc::libguarded::
    shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::~shared_lock_handle
              ((shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                *)0x2a1b1a);
  }
  else {
    local_a0 = local_18;
    local_98 = local_10;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff900,
               (char *)in_stack_fffffffffffff8f8);
    __x_00._M_str._0_7_ = in_stack_fffffffffffff920;
    __x_00._M_len = (size_t)in_stack_fffffffffffff918;
    __x_00._M_str._7_1_ = in_stack_fffffffffffff927;
    __y_00._M_str._0_4_ = in_stack_fffffffffffff910;
    __y_00._M_len = in_stack_fffffffffffff908;
    __y_00._M_str._4_4_ = in_stack_fffffffffffff914;
    bVar1 = std::operator==(__x_00,__y_00);
    if (bVar1) {
      gmlc::libguarded::
      shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
      ::lock_shared((shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                     *)in_stack_fffffffffffff928);
      generateStringVector_if<gmlc::libguarded::shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>,std::mutex>,helics::ValueFederateManager::localQuery[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)const::__2,helics::ValueFederateManager::localQuery[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)const::__3>
                (local_d0,local_e8);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_stack_fffffffffffff940,in_stack_fffffffffffff938);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8f0);
      gmlc::libguarded::
      shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
      ::~shared_lock_handle
                ((shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                  *)0x2a1c24);
    }
    else {
      local_100 = local_18;
      local_f8 = local_10;
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff900,
                 (char *)in_stack_fffffffffffff8f8);
      __x_01._M_str._0_7_ = in_stack_fffffffffffff920;
      __x_01._M_len = (size_t)in_stack_fffffffffffff918;
      __x_01._M_str._7_1_ = in_stack_fffffffffffff927;
      __y_01._M_str._0_4_ = in_stack_fffffffffffff910;
      __y_01._M_len = in_stack_fffffffffffff908;
      __y_01._M_str._4_4_ = in_stack_fffffffffffff914;
      bVar1 = std::operator==(__x_01,__y_01);
      if (bVar1) {
        gmlc::libguarded::
        shared_guarded_opt<std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>,_std::shared_mutex>
        ::lock_shared((shared_guarded_opt<std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>,_std::shared_mutex>
                       *)in_stack_fffffffffffff928);
        generateStringVector<gmlc::libguarded::shared_lock_handle<std::multimap<std::__cxx11::string,helics::InterfaceHandle,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>>,std::shared_mutex>,helics::ValueFederateManager::localQuery(std::basic_string_view<char,std::char_traits<char>>)const::__4>
                  (local_130,local_148);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  in_stack_fffffffffffff940,in_stack_fffffffffffff938);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8f0);
        gmlc::libguarded::
        shared_lock_handle<std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>,_std::shared_mutex>
        ::~shared_lock_handle
                  ((shared_lock_handle<std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>,_std::shared_mutex>
                    *)0x2a1d15);
      }
      else {
        local_160 = local_18;
        local_158 = local_10;
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff900,
                   (char *)in_stack_fffffffffffff8f8);
        __x_02._M_str._0_7_ = in_stack_fffffffffffff920;
        __x_02._M_len = (size_t)in_stack_fffffffffffff918;
        __x_02._M_str._7_1_ = in_stack_fffffffffffff927;
        __y_02._M_str._0_4_ = in_stack_fffffffffffff910;
        __y_02._M_len = in_stack_fffffffffffff908;
        __y_02._M_str._4_4_ = in_stack_fffffffffffff914;
        bVar1 = std::operator==(__x_02,__y_02);
        if (bVar1) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_fffffffffffff8f0,(char *)in_stack_fffffffffffff8e8);
          gmlc::libguarded::
          shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
          ::lock((shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                  *)in_stack_fffffffffffff928);
          local_18c = 0;
          local_198 = gmlc::libguarded::
                      shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                      ::operator*(&local_188);
          gmlc::containers::
          DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
          ::begin((DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
                   *)in_stack_fffffffffffff8f0);
          gmlc::containers::
          DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
          ::end((DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
                 *)in_stack_fffffffffffff8f0);
          while (bVar1 = gmlc::containers::
                         BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*>::
                         operator!=(&local_1b0,&local_1c8), bVar1) {
            local_1d0 = gmlc::containers::
                        BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*>::
                        operator*(&local_1b0);
            bVar1 = Input::isUpdated(in_stack_fffffffffffff8e8);
            if (bVar1) {
              CLI::std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff938 >> 0x20));
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(in_stack_fffffffffffff900,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff8f8);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff8f0);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back(in_stack_fffffffffffff900,(char)((ulong)in_stack_fffffffffffff8f8 >> 0x38));
            }
            local_18c = local_18c + 1;
            gmlc::containers::BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*>::
            operator++((BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> *)
                       in_stack_fffffffffffff8f0);
          }
          pvVar3 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff8f0);
          __c = (char)((ulong)in_stack_fffffffffffff8f8 >> 0x38);
          if (*pvVar3 == ',') {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff8f0);
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(in_stack_fffffffffffff900,__c);
          gmlc::libguarded::
          shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
          ::~shared_lock_handle
                    ((shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                      *)0x2a1f8c);
        }
        else {
          local_200 = local_18;
          local_1f8 = local_10;
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff900,
                     (char *)in_stack_fffffffffffff8f8);
          __x_03._M_str._0_7_ = in_stack_fffffffffffff920;
          __x_03._M_len = (size_t)in_stack_fffffffffffff918;
          __x_03._M_str._7_1_ = in_stack_fffffffffffff927;
          __y_03._M_str._0_4_ = in_stack_fffffffffffff910;
          __y_03._M_len = in_stack_fffffffffffff908;
          __y_03._M_str._4_4_ = in_stack_fffffffffffff914;
          bVar1 = std::operator==(__x_03,__y_03);
          if (bVar1) {
            gmlc::libguarded::
            shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
            ::lock_shared((shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                           *)in_stack_fffffffffffff928);
            generateStringVector_if<gmlc::libguarded::shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,helics::InterfaceHandle,(reference_stability)0,5>,std::mutex>,helics::ValueFederateManager::localQuery[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)const::__5,helics::ValueFederateManager::localQuery[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)const::__6>
                      (local_230,local_248);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffff940,in_stack_fffffffffffff938);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff8f0);
            gmlc::libguarded::
            shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
            ::~shared_lock_handle
                      ((shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                        *)0x2a2066);
          }
          else {
            local_260 = local_18;
            local_258 = local_10;
            CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff900
                       ,(char *)in_stack_fffffffffffff8f8);
            __x_04._M_str._0_7_ = in_stack_fffffffffffff920;
            __x_04._M_len = (size_t)in_stack_fffffffffffff918;
            __x_04._M_str._7_1_ = in_stack_fffffffffffff927;
            __y_04._M_str._0_4_ = in_stack_fffffffffffff910;
            __y_04._M_len = in_stack_fffffffffffff908;
            __y_04._M_str._4_4_ = in_stack_fffffffffffff914;
            bVar1 = std::operator==(__x_04,__y_04);
            if (bVar1) {
              fileops::JsonBuilder::JsonBuilder((JsonBuilder *)0x2a2100);
              gmlc::libguarded::
              shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
              ::lock_shared((shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                             *)in_stack_fffffffffffff928);
              local_280 = local_298;
              gmlc::libguarded::
              shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
              ::begin((shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                       *)in_stack_fffffffffffff8f0);
              gmlc::libguarded::
              shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
              ::end((shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                     *)in_stack_fffffffffffff8f0);
              while (bVar1 = gmlc::containers::
                             BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*>::
                             operator!=(&local_2b0,&local_2c8), bVar1) {
                local_2d0 = gmlc::containers::
                            BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*>::
                            operator*(&local_2b0);
                bVar1 = Input::isUpdated(in_stack_fffffffffffff8e8);
                if (bVar1) {
                  Input::Input(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
                  local_404 = Input::getHelicsType(&local_400);
                  if ((local_404 == HELICS_ANY) || (local_404 == HELICS_UNKNOWN)) {
                    local_404 = Input::getHelicsInjectionType(local_2d0);
                  }
                  if (local_404 == HELICS_DOUBLE) {
                    iVar2 = (*(local_2d0->super_Interface)._vptr_Interface[4])();
                    in_stack_fffffffffffff940 = (Input *)CONCAT44(extraout_var,iVar2);
                    in_stack_fffffffffffff938 =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         Input::getValue<double>(in_stack_fffffffffffff8f0);
                    fileops::JsonBuilder::addElement
                              ((JsonBuilder *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                               (double)in_stack_fffffffffffffa50);
                  }
                  else if (local_404 == HELICS_VECTOR) {
                    iVar2 = (*(local_2d0->super_Interface)._vptr_Interface[4])();
                    in_stack_fffffffffffff930 = (Input *)CONCAT44(extraout_var_00,iVar2);
                    Input::getValue<std::vector<double,std::allocator<double>>>
                              (in_stack_fffffffffffff8f8);
                    fileops::JsonBuilder::addElement
                              ((JsonBuilder *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0)
                    ;
                    CLI::std::vector<double,_std::allocator<double>_>::~vector
                              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff900)
                    ;
                  }
                  else {
                    iVar2 = (*(local_2d0->super_Interface)._vptr_Interface[4])();
                    in_stack_fffffffffffff928 = (Input *)CONCAT44(extraout_var_01,iVar2);
                    Input::getValue<std::__cxx11::string>(in_stack_fffffffffffff8f8);
                    fileops::JsonBuilder::addElement
                              ((JsonBuilder *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                               in_stack_fffffffffffffa50);
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff8f0);
                  }
                  Input::~Input(in_stack_fffffffffffff8f0);
                }
                gmlc::containers::
                BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*>::operator++
                          ((BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> *)
                           in_stack_fffffffffffff8f0);
              }
              gmlc::libguarded::
              shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
              ::~shared_lock_handle
                        ((shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                          *)0x2a218d);
              fileops::JsonBuilder::generate_abi_cxx11_((JsonBuilder *)in_stack_fffffffffffff918);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffff940,in_stack_fffffffffffff938);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff8f0);
              fileops::JsonBuilder::~JsonBuilder((JsonBuilder *)0x2a2479);
            }
            else {
              local_470 = local_18;
              local_468 = local_10;
              CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffff900,(char *)in_stack_fffffffffffff8f8);
              __x_05._M_str._0_7_ = in_stack_fffffffffffff920;
              __x_05._M_len = (size_t)in_stack_fffffffffffff918;
              __x_05._M_str._7_1_ = in_stack_fffffffffffff927;
              __y_05._M_str._0_4_ = in_stack_fffffffffffff910;
              __y_05._M_len = in_stack_fffffffffffff908;
              __y_05._M_str._4_4_ = in_stack_fffffffffffff914;
              bVar1 = std::operator==(__x_05,__y_05);
              if (bVar1) {
                fileops::JsonBuilder::JsonBuilder((JsonBuilder *)0x2a24ff);
                gmlc::libguarded::
                shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                ::lock_shared((shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                               *)in_stack_fffffffffffff928);
                local_490 = local_4a8;
                gmlc::libguarded::
                shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                ::begin((shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                         *)in_stack_fffffffffffff8f0);
                gmlc::libguarded::
                shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                ::end((shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                       *)in_stack_fffffffffffff8f0);
                while (bVar1 = gmlc::containers::
                               BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*>
                               ::operator!=(&local_4c0,&local_4d8), bVar1) {
                  this_00 = gmlc::containers::
                            BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*>::
                            operator*(&local_4c0);
                  in_stack_fffffffffffff918 = this_00;
                  Input::Input(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
                  Input::checkUpdate(in_stack_fffffffffffff940,
                                     SUB81((ulong)in_stack_fffffffffffff938 >> 0x38,0));
                  local_614 = Input::getHelicsType((Input *)&stack0xfffffffffffff9f0);
                  if ((local_614 == HELICS_ANY) || (local_614 == HELICS_UNKNOWN)) {
                    local_614 = Input::getHelicsInjectionType(this_00);
                  }
                  if (local_614 == HELICS_DOUBLE) {
                    (*(this_00->super_Interface)._vptr_Interface[4])();
                    in_stack_fffffffffffff900 =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         Input::getValue<double>(in_stack_fffffffffffff8f0);
                    fileops::JsonBuilder::addElement
                              ((JsonBuilder *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                               (double)in_stack_fffffffffffffa50);
                  }
                  else if (local_614 == HELICS_VECTOR) {
                    iVar2 = (*(this_00->super_Interface)._vptr_Interface[4])();
                    in_stack_fffffffffffff8f8 = (Input *)CONCAT44(extraout_var_02,iVar2);
                    Input::getValue<std::vector<double,std::allocator<double>>>
                              (in_stack_fffffffffffff8f8);
                    fileops::JsonBuilder::addElement
                              ((JsonBuilder *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0)
                    ;
                    CLI::std::vector<double,_std::allocator<double>_>::~vector
                              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff900)
                    ;
                  }
                  else {
                    iVar2 = (*(this_00->super_Interface)._vptr_Interface[4])();
                    in_stack_fffffffffffff8f0 = (Input *)CONCAT44(extraout_var_03,iVar2);
                    Input::getValue<std::__cxx11::string>(in_stack_fffffffffffff8f8);
                    fileops::JsonBuilder::addElement
                              ((JsonBuilder *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                               in_stack_fffffffffffffa50);
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff8f0);
                  }
                  Input::~Input(in_stack_fffffffffffff8f0);
                  gmlc::containers::
                  BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*>::operator++
                            ((BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> *
                             )in_stack_fffffffffffff8f0);
                }
                gmlc::libguarded::
                shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                ::~shared_lock_handle
                          ((shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                            *)0x2a258c);
                fileops::JsonBuilder::generate_abi_cxx11_((JsonBuilder *)in_stack_fffffffffffff918);
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff940,in_stack_fffffffffffff938);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff8f0);
                fileops::JsonBuilder::~JsonBuilder((JsonBuilder *)0x2a2866);
              }
            }
          }
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

std::string ValueFederateManager::localQuery(std::string_view queryStr) const
{
    std::string ret;
    if (queryStr == "inputs") {
        ret = generateStringVector_if(
            inputs.lock_shared(),
            [](const auto& info) { return info.getName(); },
            [](const auto& info) { return (!info.getName().empty()); });
    } else if (queryStr == "publications") {
        ret = generateStringVector_if(
            publications.lock_shared(),
            [](const auto& info) { return info.getName(); },
            [](const auto& info) { return (!info.getName().empty()); });
    } else if (queryStr == "subscriptions") {
        ret = generateStringVector(targetIDs.lock_shared(),
                                   [](const auto& target) { return target.first; });
    } else if (queryStr == "updated_input_indices") {
        ret = "[";
        auto hand = inputs.lock();
        int ii = 0;
        for (const auto& inp : *hand) {
            if (inp.isUpdated()) {
                ret.append(std::to_string(ii));
                ret.push_back(',');
            }
            ++ii;
        }
        if (ret.back() == ',') {
            ret.pop_back();
        }
        ret.push_back(']');
    } else if (queryStr == "updated_input_names") {
        ret = generateStringVector_if(
            inputs.lock_shared(),
            [](const auto& inp) { return inp.getDisplayName(); },
            [](const auto& inp) { return (inp.isUpdated()); });
    } else if (queryStr == "updates") {
        fileops::JsonBuilder JB;
        for (const auto& inp : inputs.lock_shared()) {
            if (inp.isUpdated()) {
                auto inpTemp = inp;
                auto iType = inpTemp.getHelicsType();
                if (iType == DataType::HELICS_ANY || iType == DataType::HELICS_UNKNOWN) {
                    iType = inp.getHelicsInjectionType();
                }
                if (iType == DataType::HELICS_DOUBLE) {
                    JB.addElement(inp.getDisplayName(), inpTemp.getValue<double>());
                } else if (iType == DataType::HELICS_VECTOR) {
                    JB.addElement(inp.getDisplayName(), inpTemp.getValue<std::vector<double>>());
                } else {
                    JB.addElement(inp.getDisplayName(), inpTemp.getValue<std::string>());
                }
            }
        }
        ret = JB.generate();
    } else if (queryStr == "values") {
        fileops::JsonBuilder JB;
        for (const auto& inp : inputs.lock_shared()) {
            auto inpTemp = inp;
            inpTemp.checkUpdate(true);
            auto iType = inpTemp.getHelicsType();
            if (iType == DataType::HELICS_ANY || iType == DataType::HELICS_UNKNOWN) {
                iType = inp.getHelicsInjectionType();
            }
            if (iType == DataType::HELICS_DOUBLE) {
                JB.addElement(inp.getDisplayName(), inpTemp.getValue<double>());
            } else if (iType == DataType::HELICS_VECTOR) {
                JB.addElement(inp.getDisplayName(), inpTemp.getValue<std::vector<double>>());
            } else {
                JB.addElement(inp.getDisplayName(), inpTemp.getValue<std::string>());
            }
        }
        ret = JB.generate();
    }
    return ret;
}